

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::anon_unknown_59::InMemoryFile::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,InMemoryFile *this,uint64_t offset,
          uint64_t size)

{
  ulong uVar1;
  uchar *puVar2;
  ArrayPtr<unsigned_char> AVar3;
  size_t actual;
  uint64_t size_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  Array<unsigned_char> *result;
  
  heapArray<unsigned_char>(__return_storage_ptr__,size);
  AVar3 = kj::Array::operator_cast_to_ArrayPtr((Array *)__return_storage_ptr__);
  uVar1 = read(this,(int)offset,AVar3.ptr,AVar3.size_);
  if (uVar1 < size) {
    puVar2 = Array<unsigned_char>::begin(__return_storage_ptr__);
    memset(puVar2 + uVar1,0,size - uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const override {
    // Return a copy.

    // Allocate exactly the size requested.
    auto result = heapArray<byte>(size);

    // Use read() to fill it.
    size_t actual = read(offset, result);

    // Ignore the rest.
    if (actual < size) {
      memset(result.begin() + actual, 0, size - actual);
    }

    return result;
  }